

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::SimpleQueriesTest::iterate(SimpleQueriesTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  ContextInfo *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  uint local_1d0 [4];
  MessageBuilder local_1c0;
  double local_40;
  GLdouble doubleValue;
  int iStack_30;
  GLfloat floatValue;
  GLint64 int64Value;
  GLint intValue;
  GLboolean boolValue;
  Functions *gl;
  SimpleQueriesTest *this_local;
  
  gl = (Functions *)this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_parallel_shader_compile");
  if (bVar1) {
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    _intValue = CONCAT44(extraout_var,iVar2);
    (**(code **)(_intValue + 0x798))(0x91b0,(long)&int64Value + 7);
    dVar3 = (**(code **)(_intValue + 0x800))();
    glu::checkError(dVar3,"getBooleanv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x5f);
    (**(code **)(_intValue + 0x868))(0x91b0,&int64Value);
    dVar3 = (**(code **)(_intValue + 0x800))();
    glu::checkError(dVar3,"getIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x62);
    (**(code **)(_intValue + 0x850))(0x91b0,&stack0xffffffffffffffd0);
    dVar3 = (**(code **)(_intValue + 0x800))();
    glu::checkError(dVar3,"getInteger64v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x65);
    (**(code **)(_intValue + 0x818))(0x91b0,(long)&doubleValue + 4);
    dVar3 = (**(code **)(_intValue + 0x800))();
    glu::checkError(dVar3,"getFloatv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x68);
    (**(code **)(_intValue + 0x7f8))(0x91b0,&local_40);
    dVar3 = (**(code **)(_intValue + 0x800))();
    glu::checkError(dVar3,"getDoublev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x6b);
    if (((((bool)int64Value._7_1_ == ((int)int64Value != 0)) && ((int)int64Value == iStack_30)) &&
        ((int)int64Value == (int)doubleValue._4_4_)) && ((int)int64Value == (int)local_40)) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_1c0,(char (*) [43])"Simple queries returned different values: ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])"bool(");
      local_1d0[0] = (uint)int64Value._7_1_;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)local_1d0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2aa3bc7);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])0x2c443ac);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&int64Value);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2aa3bc7);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])"int64(");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(long *)&stack0xffffffffffffffd0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2aa3bc7);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2c4c0ec);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)((long)&doubleValue + 4));
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2aa3bc7);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])"double(");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_40);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SimpleQueriesTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLboolean boolValue;
	GLint	 intValue;
	GLint64   int64Value;
	GLfloat   floatValue;
	GLdouble  doubleValue;

	gl.getBooleanv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &boolValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getBooleanv");

	gl.getIntegerv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &intValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv");

	gl.getInteger64v(GL_MAX_SHADER_COMPILER_THREADS_ARB, &int64Value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getInteger64v");

	gl.getFloatv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &floatValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getFloatv");

	gl.getDoublev(GL_MAX_SHADER_COMPILER_THREADS_ARB, &doubleValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getDoublev");

	if (boolValue != (intValue != 0) || intValue != (GLint)int64Value || intValue != (GLint)floatValue ||
		intValue != (GLint)doubleValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Simple queries returned different values: "
						   << "bool(" << (int)boolValue << "), "
						   << "int(" << intValue << "), "
						   << "int64(" << int64Value << "), "
						   << "float(" << floatValue << "), "
						   << "double(" << doubleValue << ")" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}